

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O0

ExactFloat __thiscall
ExactFloat::SignedSum(ExactFloat *this,int a_sign,ExactFloat *a,int b_sign,ExactFloat *b)

{
  ExactFloat *pEVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  BIGNUM *pBVar8;
  BIGNUM *extraout_RDX;
  BIGNUM *extraout_RDX_00;
  BigNum BVar9;
  BIGNUM *extraout_RDX_01;
  ExactFloat EVar10;
  S2LogMessage local_a0;
  S2LogMessageVoidify local_8a;
  byte local_89;
  S2LogMessage local_88;
  S2LogMessageVoidify local_72;
  byte local_71;
  S2LogMessage local_70;
  S2LogMessageVoidify local_5e;
  undefined1 local_5d;
  byte local_49;
  S2LogMessage local_48;
  S2LogMessageVoidify local_31;
  ExactFloat *local_30;
  ExactFloat *b_local;
  ExactFloat *pEStack_20;
  int b_sign_local;
  ExactFloat *a_local;
  ExactFloat *pEStack_10;
  int a_sign_local;
  ExactFloat *r;
  
  local_30 = b;
  b_local._4_4_ = b_sign;
  pEStack_20 = a;
  a_local._4_4_ = a_sign;
  pEStack_10 = this;
  bVar2 = is_normal(a);
  if ((bVar2) && (bVar2 = is_normal(local_30), bVar2)) {
    if (pEStack_20->bn_exp_ < local_30->bn_exp_) {
      std::swap<int>((int *)((long)&a_local + 4),(int *)((long)&b_local + 4));
      std::swap<ExactFloat_const*>(&stack0xffffffffffffffe0,&local_30);
    }
    local_5d = 0;
    ExactFloat(this);
    pEVar1 = pEStack_20;
    if (local_30->bn_exp_ < pEStack_20->bn_exp_) {
      local_71 = 0;
      pBVar5 = (BIGNUM *)BigNum::get(&this->bn_);
      pBVar6 = (BIGNUM *)BigNum::get(&pEStack_20->bn_);
      iVar3 = BN_lshift(pBVar5,pBVar6,pEStack_20->bn_exp_ - local_30->bn_exp_);
      if (iVar3 == 0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_70,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                   ,0x22b,kFatal,(ostream *)&std::cerr);
        local_71 = 1;
        poVar4 = S2LogMessage::stream(&local_70);
        poVar4 = std::operator<<(poVar4,
                                 "Check failed: BN_lshift(r.bn_.get(), a->bn_.get(), a->bn_exp_ - b->bn_exp_) "
                                );
        S2LogMessageVoidify::operator&(&local_5e,poVar4);
      }
      pEVar1 = this;
      if ((local_71 & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_70);
      }
    }
    pEStack_20 = pEVar1;
    this->bn_exp_ = local_30->bn_exp_;
    if (a_local._4_4_ == b_local._4_4_) {
      local_89 = 0;
      pBVar5 = (BIGNUM *)BigNum::get(&this->bn_);
      pBVar6 = (BIGNUM *)BigNum::get(&pEStack_20->bn_);
      pBVar7 = (BIGNUM *)BigNum::get(&local_30->bn_);
      iVar3 = BN_add(pBVar5,pBVar6,pBVar7);
      if (iVar3 == 0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_88,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                   ,0x230,kFatal,(ostream *)&std::cerr);
        local_89 = 1;
        poVar4 = S2LogMessage::stream(&local_88);
        poVar4 = std::operator<<(poVar4,
                                 "Check failed: BN_add(r.bn_.get(), a->bn_.get(), b->bn_.get()) ");
        S2LogMessageVoidify::operator&(&local_72,poVar4);
      }
      if ((local_89 & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_88);
      }
      this->sign_ = a_local._4_4_;
    }
    else {
      pBVar5 = (BIGNUM *)BigNum::get(&this->bn_);
      pBVar6 = (BIGNUM *)BigNum::get(&pEStack_20->bn_);
      pBVar7 = (BIGNUM *)BigNum::get(&local_30->bn_);
      iVar3 = BN_sub(pBVar5,pBVar6,pBVar7);
      if (iVar3 == 0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_a0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                   ,0x236,kFatal,(ostream *)&std::cerr);
        poVar4 = S2LogMessage::stream(&local_a0);
        poVar4 = std::operator<<(poVar4,
                                 "Check failed: BN_sub(r.bn_.get(), a->bn_.get(), b->bn_.get()) ");
        S2LogMessageVoidify::operator&(&local_8a,poVar4);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_a0);
      }
      pBVar8 = BigNum::get(&this->bn_);
      iVar3 = BN_is_zero(pBVar8);
      if (iVar3 == 0) {
        pBVar8 = BigNum::get(&this->bn_);
        iVar3 = BN_is_negative(pBVar8);
        if (iVar3 == 0) {
          this->sign_ = a_local._4_4_;
        }
        else {
          this->sign_ = b_local._4_4_;
          pBVar5 = (BIGNUM *)BigNum::get(&this->bn_);
          BN_set_negative(pBVar5,0);
        }
      }
      else {
        this->sign_ = 1;
      }
    }
    Canonicalize(this);
    BVar9.bn_ = extraout_RDX_01;
  }
  else {
    bVar2 = is_nan(pEStack_20);
    if (bVar2) {
      ExactFloat(this,pEStack_20);
      BVar9.bn_ = extraout_RDX;
    }
    else {
      bVar2 = is_nan(local_30);
      if (bVar2) {
        ExactFloat(this,local_30);
        BVar9.bn_ = extraout_RDX_00;
      }
      else {
        bVar2 = is_inf(pEStack_20);
        if (bVar2) {
          bVar2 = is_inf(local_30);
          if ((bVar2) && (a_local._4_4_ != b_local._4_4_)) {
            EVar10 = NaN();
            BVar9 = EVar10.bn_.bn_;
          }
          else {
            EVar10 = Infinity(this,a_local._4_4_);
            BVar9 = EVar10.bn_.bn_;
          }
        }
        else {
          bVar2 = is_inf(local_30);
          if (bVar2) {
            EVar10 = Infinity(this,b_local._4_4_);
            BVar9 = EVar10.bn_.bn_;
          }
          else {
            bVar2 = is_zero(pEStack_20);
            if (bVar2) {
              bVar2 = is_zero(local_30);
              if (bVar2) {
                if (a_local._4_4_ == b_local._4_4_) {
                  EVar10 = SignedZero(this,a_local._4_4_);
                  BVar9 = EVar10.bn_.bn_;
                }
                else {
                  EVar10 = SignedZero(this,1);
                  BVar9 = EVar10.bn_.bn_;
                }
              }
              else {
                EVar10 = CopyWithSign(this,(int)local_30);
                BVar9 = EVar10.bn_.bn_;
              }
            }
            else {
              bVar2 = is_zero(local_30);
              local_49 = 0;
              if (((bVar2 ^ 0xffU) & 1) != 0) {
                S2FatalLogMessage::S2FatalLogMessage
                          ((S2FatalLogMessage *)&local_48,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                           ,0x21f,kFatal,(ostream *)&std::cerr);
                local_49 = 1;
                poVar4 = S2LogMessage::stream(&local_48);
                poVar4 = std::operator<<(poVar4,"Check failed: b->is_zero() ");
                S2LogMessageVoidify::operator&(&local_31,poVar4);
              }
              if ((local_49 & 1) != 0) {
                S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
              }
              EVar10 = CopyWithSign(this,(int)pEStack_20);
              BVar9 = EVar10.bn_.bn_;
            }
          }
        }
      }
    }
  }
  EVar10.bn_.bn_ = BVar9.bn_;
  EVar10._0_8_ = this;
  return EVar10;
}

Assistant:

ExactFloat ExactFloat::SignedSum(int a_sign, const ExactFloat* a,
                                 int b_sign, const ExactFloat* b) {
  if (!a->is_normal() || !b->is_normal()) {
    // Handle zero, infinity, and NaN according to IEEE 754-2008.
    if (a->is_nan()) return *a;
    if (b->is_nan()) return *b;
    if (a->is_inf()) {
      // Adding two infinities with opposite sign yields NaN.
      if (b->is_inf() && a_sign != b_sign) return NaN();
      return Infinity(a_sign);
    }
    if (b->is_inf()) return Infinity(b_sign);
    if (a->is_zero()) {
      if (!b->is_zero()) return b->CopyWithSign(b_sign);
      // Adding two zeros with the same sign preserves the sign.
      if (a_sign == b_sign) return SignedZero(a_sign);
      // Adding two zeros of opposite sign produces +0.
      return SignedZero(+1);
    }
    S2_DCHECK(b->is_zero());
    return a->CopyWithSign(a_sign);
  }
  // Swap the numbers if necessary so that "a" has the larger bn_exp_.
  if (a->bn_exp_ < b->bn_exp_) {
    using std::swap;
    swap(a_sign, b_sign);
    swap(a, b);
  }
  // Shift "a" if necessary so that both values have the same bn_exp_.
  ExactFloat r;
  if (a->bn_exp_ > b->bn_exp_) {
    S2_CHECK(BN_lshift(r.bn_.get(), a->bn_.get(), a->bn_exp_ - b->bn_exp_));
    a = &r;  // The only field of "a" used below is bn_.
  }
  r.bn_exp_ = b->bn_exp_;
  if (a_sign == b_sign) {
    S2_CHECK(BN_add(r.bn_.get(), a->bn_.get(), b->bn_.get()));
    r.sign_ = a_sign;
  } else {
    // Note that the BIGNUM documentation is out of date -- all methods now
    // allow the result to be the same as any input argument, so it is okay if
    // (a == &r) due to the shift above.
    S2_CHECK(BN_sub(r.bn_.get(), a->bn_.get(), b->bn_.get()));
    if (BN_is_zero(r.bn_.get())) {
      r.sign_ = +1;
    } else if (BN_is_negative(r.bn_.get())) {
      // The magnitude of "b" was larger.
      r.sign_ = b_sign;
      BN_set_negative(r.bn_.get(), false);
    } else {
      // They were equal, or the magnitude of "a" was larger.
      r.sign_ = a_sign;
    }
  }
  r.Canonicalize();
  return r;
}